

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  Layer *pLVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  Mat *pMVar8;
  undefined8 in_RSI;
  long *in_RDI;
  bool bVar9;
  Mat weight_data_int8_scales_g_1;
  Mat weights_1 [4];
  Mat weight_data_int8_scales_g;
  Mat weights [5];
  ParamDict pd;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  int i_2;
  float *ptr_1;
  int size_1;
  int i_1;
  float *ptr;
  int size;
  ParamDict *in_stack_ffffffffffffefb0;
  Mat *in_stack_ffffffffffffefb8;
  Layer *in_stack_ffffffffffffefc0;
  Mat *in_stack_ffffffffffffefc8;
  Mat *in_stack_ffffffffffffefd0;
  Mat *local_ff8;
  Mat *local_f40;
  Mat *local_f00;
  Mat *local_e38;
  undefined1 local_dc0 [16];
  void *local_db0;
  int *local_da8;
  undefined8 local_da0;
  undefined4 local_d98;
  long *local_d90;
  undefined4 local_d88;
  undefined4 local_d84;
  undefined4 local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined8 local_d70;
  void *local_d68;
  int *local_d60;
  undefined8 local_d58;
  undefined4 local_d50;
  long *local_d48;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  undefined8 local_d28;
  undefined4 *local_d20;
  int *local_d18;
  undefined8 local_d10;
  undefined4 local_d08;
  long *local_d00;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  int local_ce8;
  undefined8 local_ce0;
  Mat local_cd8;
  undefined4 *local_c90;
  int *local_c88;
  undefined4 *local_c80;
  undefined4 local_c78;
  long *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 *local_c50;
  void *local_c48;
  int *local_c40;
  void *local_c38;
  undefined4 local_c30;
  long *local_c28;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  void *local_c08;
  void *local_c00;
  int *local_bf8;
  void *local_bf0;
  undefined4 local_be8;
  long *local_be0;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  void *local_bc0;
  undefined1 auStack_bb8 [24];
  void *local_ba0;
  Allocator *local_b98;
  undefined8 local_b90;
  int local_b88;
  long *local_b80;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined8 local_b60;
  void *local_b58;
  int *local_b50;
  undefined8 local_b48;
  undefined4 local_b40;
  long *local_b38;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined8 local_b18;
  undefined4 *local_b10;
  int *local_b08;
  undefined8 local_b00;
  undefined4 local_af8;
  long *local_af0;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 local_adc;
  int local_ad8;
  undefined8 local_ad0;
  Mat local_ac8;
  Mat local_a80;
  undefined4 *local_a38;
  int *local_a30;
  undefined4 *local_a28;
  undefined4 local_a20;
  long *local_a18;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 *local_9f8;
  void *local_9f0;
  int *local_9e8;
  void *local_9e0;
  undefined4 local_9d8;
  long *local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  void *local_9b0;
  void *local_9a8;
  int *local_9a0;
  void *local_998;
  undefined4 local_990;
  long *local_988;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  void *local_968;
  undefined1 auStack_960 [24];
  Layer *local_948;
  Mat local_940;
  Mat local_8f8;
  void *local_8a0;
  int *local_898;
  long local_890;
  undefined4 local_888;
  long *local_880;
  undefined4 local_878;
  uint local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  long local_860;
  Mat local_858;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  undefined8 local_7f8;
  Mat *local_7e8;
  Mat *local_7e0;
  Mat *local_7d8;
  void **local_7d0;
  Mat *local_7c0;
  void **local_7a8;
  undefined4 **local_798;
  void **local_788;
  Mat *local_778;
  void **local_760;
  undefined4 **local_750;
  void **local_740;
  Mat *local_730;
  Mat *local_720;
  Mat *local_710;
  void **local_6f8;
  void **local_6f0;
  void **local_6e8;
  void **local_6d8;
  void **local_6d0;
  void **local_6c8;
  int local_6c0;
  undefined4 local_6bc;
  undefined4 **local_6b8;
  undefined4 **local_6b0;
  undefined4 **local_6a8;
  int local_6a0;
  undefined4 local_69c;
  Mat *local_698;
  Mat *local_690;
  Mat *local_688;
  void **local_678;
  void **local_670;
  void **local_668;
  void **local_658;
  void **local_650;
  void **local_648;
  int local_640;
  undefined4 local_63c;
  undefined4 **local_638;
  undefined4 **local_630;
  undefined4 **local_628;
  int local_620;
  undefined4 local_61c;
  Mat *local_618;
  Mat *local_610;
  Mat *local_608;
  int local_600;
  undefined4 local_5fc;
  Mat *local_5f8;
  Mat *local_5f0;
  Mat *local_5e8;
  Mat *local_5d8;
  Mat *local_5d0;
  Mat *local_5c8;
  Mat *local_5b8;
  int local_5b0;
  undefined4 local_5ac;
  Mat *local_5a8;
  int local_5a0;
  undefined4 local_59c;
  Mat *local_598;
  int local_590;
  undefined4 local_58c;
  undefined4 **local_588;
  int local_580;
  undefined4 local_57c;
  void **local_578;
  int local_570;
  undefined4 local_56c;
  void **local_568;
  int local_560;
  undefined4 local_55c;
  Mat *local_558;
  int local_550;
  undefined4 local_54c;
  undefined4 **local_548;
  int local_540;
  undefined4 local_53c;
  void **local_538;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  int local_510;
  undefined4 local_50c;
  Mat *local_508;
  int local_4f0;
  undefined4 local_4ec;
  Mat *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  Mat *local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  void **local_4a8;
  int local_490;
  undefined4 local_48c;
  undefined4 **local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  int local_440;
  undefined4 local_43c;
  Mat *local_438;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  int local_400;
  undefined4 local_3fc;
  undefined4 **local_3f8;
  int local_3e0;
  undefined4 local_3dc;
  void **local_3d8;
  Mat *local_3a8;
  int local_390;
  undefined4 local_38c;
  void **local_388;
  undefined4 local_380;
  int local_37c;
  long *local_378;
  void **local_370;
  undefined4 local_368;
  int local_364;
  long *local_360;
  void **local_358;
  undefined4 local_350;
  int local_34c;
  long *local_348;
  void **local_340;
  undefined4 local_338;
  int local_334;
  long *local_330;
  void **local_328;
  int local_320;
  int local_31c;
  long *local_318;
  Mat *local_310;
  uint local_308;
  int local_304;
  long *local_300;
  void **local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  int local_2dc;
  undefined4 **local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  int local_2bc;
  undefined4 **local_2b8;
  int local_2ac;
  undefined4 *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  undefined4 **local_298;
  int local_28c;
  undefined4 *local_288;
  int local_280;
  undefined4 local_27c;
  undefined4 **local_278;
  long local_270;
  long *local_268;
  long local_260;
  long *local_258;
  void *local_250;
  void *local_228;
  undefined4 *local_218;
  void *local_208;
  void *local_1f8;
  void *local_1e0;
  undefined4 *local_1d0;
  void *local_1c0;
  void *local_1b0;
  Allocator *local_1a0;
  void *local_180;
  void *local_178;
  undefined4 *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  undefined4 *local_150;
  void *local_148;
  void *local_140;
  long *local_130;
  undefined4 local_124;
  long local_120;
  void *local_118;
  uint local_10c;
  void **local_108;
  Allocator *local_100;
  int local_f4;
  size_t local_f0;
  Allocator *local_e8;
  int local_dc;
  Mat *local_d8;
  long *local_d0;
  undefined4 local_c4;
  undefined8 local_c0;
  void *local_b8;
  undefined4 local_ac;
  void **local_a8;
  long *local_a0;
  int local_94;
  undefined8 local_90;
  void *local_88;
  undefined4 local_7c;
  void **local_78;
  long *local_70;
  undefined4 local_64;
  undefined8 local_60;
  void *local_58;
  undefined4 local_4c;
  void **local_48;
  long *local_40;
  undefined4 local_34;
  undefined8 local_30;
  void *local_28;
  undefined4 local_1c;
  void **local_18;
  undefined4 **local_10;
  undefined4 **local_8;
  
  local_7fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar3 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_800 = ((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                    (long)local_7fc) /
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_7f8 = in_RSI;
  for (local_804 = 0; iVar5 = local_804,
      sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2)),
      iVar5 < (int)sVar6; local_804 = local_804 + 1) {
    ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_804);
    if (*ppLVar7 != (value_type)0x0) {
      (*(*ppLVar7)->_vptr_Layer[1])();
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x17bcadc);
  local_808 = local_800 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  local_80c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_stack_ffffffffffffefd0,
             (size_type)in_stack_ffffffffffffefc8);
  for (local_810 = 0; local_810 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_810 = local_810 + 1) {
    local_300 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x168);
    local_308 = local_7fc * local_808 * local_80c;
    local_304 = local_308 * local_810;
    local_2f8 = &local_8a0;
    local_120 = local_300[2];
    local_118 = (void *)(*local_300 + local_304 * local_120);
    local_124 = (undefined4)local_300[3];
    local_130 = (long *)local_300[4];
    local_898 = (int *)0x0;
    local_878 = 1;
    local_870 = 1;
    local_86c = 1;
    local_868 = 1;
    local_860 = (long)(int)local_308;
    local_10c = local_308;
    local_108 = local_2f8;
    local_8a0 = local_118;
    local_890 = local_120;
    local_888 = local_124;
    local_880 = local_130;
    local_874 = local_308;
    Mat::clone(&local_858,(__fn *)local_2f8,(void *)0x0,local_308,(void *)(ulong)local_308);
    local_7d0 = &local_8a0;
    local_388 = local_7d0;
    if (local_898 != (int *)0x0) {
      local_38c = 0xffffffff;
      LOCK();
      local_390 = *local_898;
      *local_898 = *local_898 + -1;
      UNLOCK();
      if (local_390 == 1) {
        if (local_880 == (long *)0x0) {
          local_250 = local_8a0;
          if (local_8a0 != (void *)0x0) {
            free(local_8a0);
          }
        }
        else {
          (**(code **)(*local_880 + 0x18))();
        }
      }
    }
    local_8a0 = (void *)0x0;
    local_890 = 0;
    local_888 = 0;
    local_878 = 0;
    local_874 = 0;
    local_870 = 0;
    local_86c = 0;
    local_868 = 0;
    local_860 = 0;
    local_898 = (int *)0x0;
    local_7e8 = &local_8f8;
    local_8f8.data = (Allocator *)0x0;
    local_8f8.elemsize = 0;
    local_8f8.elempack = 0;
    local_8f8.allocator = (Allocator *)0x0;
    local_8f8.dims = 0;
    local_8f8.w = 0;
    local_8f8.h = 0;
    local_8f8.d = 0;
    local_8f8.c = 0;
    local_8f8.cstep = 0;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
      lVar1 = *(long *)(*in_RDI + -0x18);
      local_318 = (long *)((long)in_RDI + lVar1 + 0x1b0);
      local_31c = local_80c * local_810;
      local_310 = &local_940;
      local_e8 = (Allocator *)
                 (*local_318 + (long)local_31c * *(long *)((long)in_RDI + lVar1 + 0x1c0));
      local_f0 = *(size_t *)((long)in_RDI + lVar1 + 0x1c0);
      local_f4 = *(int *)((long)in_RDI + lVar1 + 0x1c8);
      local_100 = *(Allocator **)((long)in_RDI + lVar1 + 0x1d0);
      local_d8 = &local_940;
      local_940.data = local_e8;
      local_940.refcount = (int *)0x0;
      local_940.elemsize = local_f0;
      local_940.elempack = local_f4;
      local_940.allocator = local_100;
      local_940.dims = 1;
      local_940.w = local_80c;
      local_940.h = 1;
      local_940.d = 1;
      local_940.c = 1;
      local_940.cstep = (long)local_80c;
      local_5d0 = &local_8f8;
      local_5d8 = &local_940;
      bVar9 = local_5d0 != local_5d8;
      if (bVar9) {
        local_8f8.data = (void *)0x0;
        local_8f8.elemsize = 0;
        local_8f8.elempack = 0;
        local_8f8.dims = 0;
        local_8f8.w = 0;
        local_8f8.h = 0;
        local_8f8.d = 0;
        local_8f8.c = 0;
        local_8f8.cstep = 0;
        local_8f8.refcount = (int *)0x0;
        local_8f8.data = local_e8;
        local_8f8.refcount = (int *)0x0;
        local_8f8.elemsize = local_f0;
        local_8f8.elempack = local_f4;
        local_8f8.allocator = local_100;
        local_8f8.dims = 1;
        local_8f8.w = local_80c;
        local_8f8.h = 1;
        local_8f8.d = 1;
        local_8f8.c = 1;
        local_5b8 = local_5d0;
        local_8f8.cstep = (long)local_80c;
      }
      local_8f8.c = (int)bVar9;
      local_8f8.d = (int)bVar9;
      local_8f8.h = (int)bVar9;
      local_8f8.dims = (int)bVar9;
      local_7c0 = &local_940;
      local_dc = local_80c;
      local_320 = local_80c;
      local_940.data = (Allocator *)0x0;
      local_940.elemsize = 0;
      local_940.elempack = 0;
      local_940.dims = 0;
      local_940.w = 0;
      local_940.h = 0;
      local_940.d = 0;
      local_940.c = 0;
      local_940.cstep = 0;
      local_940.refcount = (int *)0x0;
      local_5c8 = local_5d0;
      local_3a8 = local_7c0;
    }
    local_860 = 0;
    local_868 = 0;
    local_86c = 0;
    local_870 = 0;
    local_874 = 0;
    local_878 = 0;
    local_888 = 0;
    local_890 = 0;
    local_898 = (int *)0x0;
    local_8a0 = (void *)0x0;
    local_8f8.refcount = (int *)0x0;
    local_948 = create_layer((int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
    ParamDict::ParamDict((ParamDict *)in_stack_ffffffffffffefd0);
    ParamDict::set((ParamDict *)(auStack_960 + 8),0,local_80c);
    ParamDict::set((ParamDict *)(auStack_960 + 8),1,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
    ParamDict::set((ParamDict *)(auStack_960 + 8),0xb,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
    ParamDict::set((ParamDict *)(auStack_960 + 8),2,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
    ParamDict::set((ParamDict *)(auStack_960 + 8),0xc,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
    ParamDict::set((ParamDict *)(auStack_960 + 8),3,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4));
    ParamDict::set((ParamDict *)(auStack_960 + 8),0xd,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
    ParamDict::set((ParamDict *)(auStack_960 + 8),4,0);
    ParamDict::set((ParamDict *)(auStack_960 + 8),0xe,0);
    ParamDict::set((ParamDict *)(auStack_960 + 8),5,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
    ParamDict::set((ParamDict *)(auStack_960 + 8),6,local_7fc * local_808 * local_80c);
    ParamDict::set((ParamDict *)(auStack_960 + 8),8,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c));
    ParamDict::set((ParamDict *)(auStack_960 + 8),9,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110));
    ParamDict::set((ParamDict *)in_stack_ffffffffffffefc8,
                   (int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),in_stack_ffffffffffffefb8);
    (*local_948->_vptr_Layer[2])(local_948,auStack_960 + 8);
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
      local_f40 = &local_cd8;
      do {
        local_7d8 = local_f40;
        local_f40->data = (void *)0x0;
        local_f40->refcount = (int *)0x0;
        local_f40->elemsize = 0;
        local_f40->elempack = 0;
        local_f40->allocator = (Allocator *)0x0;
        local_f40->dims = 0;
        local_f40->w = 0;
        local_f40->h = 0;
        local_f40->d = 0;
        local_f40->c = 0;
        local_f40->cstep = 0;
        local_f40 = local_f40 + 1;
      } while (local_f40 != (Mat *)auStack_bb8);
      local_698 = &local_858;
      local_690 = &local_cd8;
      if (&local_cd8 != local_698) {
        if (local_858.refcount != (int *)0x0) {
          local_69c = 1;
          LOCK();
          local_6a0 = *local_858.refcount;
          *local_858.refcount = *local_858.refcount + 1;
          UNLOCK();
        }
        local_558 = &local_cd8;
        if (local_cd8.refcount != (int *)0x0) {
          local_55c = 0xffffffff;
          LOCK();
          local_560 = *local_cd8.refcount;
          *local_cd8.refcount = *local_cd8.refcount + -1;
          UNLOCK();
          if (local_560 == 1) {
            if (local_cd8.allocator == (Allocator *)0x0) {
              local_168 = local_cd8.data;
              if (local_cd8.data != (void *)0x0) {
                free(local_cd8.data);
              }
            }
            else {
              (*(local_cd8.allocator)->_vptr_Allocator[3])(local_cd8.allocator,local_cd8.data);
            }
          }
        }
        local_cd8.data = local_698->data;
        local_cd8.refcount = local_698->refcount;
        local_cd8.elemsize = local_698->elemsize;
        local_cd8.elempack = local_698->elempack;
        local_cd8.allocator = local_698->allocator;
        local_cd8.dims = local_698->dims;
        local_cd8.w = local_698->w;
        local_cd8.h = local_698->h;
        local_cd8.d = local_698->d;
        local_cd8.c = local_698->c;
        local_cd8.cstep = local_698->cstep;
      }
      local_688 = &local_cd8;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
        local_2b8 = &local_d20;
        local_2bc = local_80c;
        local_2c8 = 4;
        local_2d0 = 0;
        local_d20 = (undefined4 *)0x0;
        local_d18 = (int *)0x0;
        local_d10 = 0;
        local_d08 = 0;
        local_d00 = (long *)0x0;
        local_cf8 = 0;
        local_cf4 = 0;
        local_cf0 = 0;
        local_cec = 0;
        local_ce8 = 0;
        local_ce0 = 0;
        Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                    (size_t)in_stack_ffffffffffffefc0,(Allocator *)in_stack_ffffffffffffefb8);
        local_268 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
        local_270 = (long)local_810;
        local_29c = *(undefined4 *)(*local_268 + local_270 * 4);
        local_298 = &local_d20;
        local_2a0 = (int)local_ce0 * local_ce8;
        local_2a8 = local_d20;
        for (local_2ac = 0; local_2ac < local_2a0; local_2ac = local_2ac + 1) {
          *local_2a8 = local_29c;
          local_2a8 = local_2a8 + 1;
        }
        local_6b8 = &local_d20;
        local_6b0 = &local_c90;
        local_8 = local_298;
        if (&local_c90 != local_6b8) {
          if (local_d18 != (int *)0x0) {
            local_6bc = 1;
            LOCK();
            local_6c0 = *local_d18;
            *local_d18 = *local_d18 + 1;
            UNLOCK();
          }
          local_548 = &local_c90;
          if (local_c88 != (int *)0x0) {
            local_54c = 0xffffffff;
            LOCK();
            local_550 = *local_c88;
            *local_c88 = *local_c88 + -1;
            UNLOCK();
            if (local_550 == 1) {
              if (local_c70 == (long *)0x0) {
                local_170 = local_c90;
                if (local_c90 != (undefined4 *)0x0) {
                  free(local_c90);
                }
              }
              else {
                (**(code **)(*local_c70 + 0x18))(local_c70,local_c90);
              }
            }
          }
          local_c90 = (undefined4 *)0x0;
          local_c80 = (undefined4 *)0x0;
          local_c78 = 0;
          local_c68 = 0;
          local_c64 = 0;
          local_c60 = 0;
          local_c5c = 0;
          local_c58 = 0;
          local_c50 = (undefined4 *)0x0;
          local_c88 = (int *)0x0;
          local_c90 = *local_6b8;
          local_c88 = local_6b8[1];
          local_c80 = local_6b8[2];
          local_c78 = *(undefined4 *)(local_6b8 + 3);
          local_c70 = (long *)local_6b8[4];
          local_c68 = *(undefined4 *)(local_6b8 + 5);
          local_c64 = *(undefined4 *)((long)local_6b8 + 0x2c);
          local_c60 = *(undefined4 *)(local_6b8 + 6);
          local_c5c = *(undefined4 *)((long)local_6b8 + 0x34);
          local_c58 = *(undefined4 *)(local_6b8 + 7);
          local_c50 = local_6b8[8];
        }
        lVar1 = *(long *)(*in_RDI + -0x18);
        local_360 = (long *)((long)in_RDI + lVar1 + 0x240);
        local_358 = &local_d68;
        local_364 = local_810;
        local_368 = 1;
        local_58 = (void *)(*local_360 + (long)local_810 * *(long *)((long)in_RDI + lVar1 + 0x250));
        local_60 = *(undefined8 *)((long)in_RDI + lVar1 + 0x250);
        local_64 = *(undefined4 *)((long)in_RDI + lVar1 + 600);
        local_70 = *(long **)((long)in_RDI + lVar1 + 0x260);
        local_48 = &local_d68;
        local_4c = 1;
        local_d68 = local_58;
        local_d60 = (int *)0x0;
        local_d58 = local_60;
        local_d50 = local_64;
        local_d48 = local_70;
        local_d40 = 1;
        local_d3c = 1;
        local_d38 = 1;
        local_d34 = 1;
        local_d30 = 1;
        local_d28 = 1;
        local_6d8 = &local_d68;
        local_6d0 = &local_c48;
        local_6a8 = &local_c90;
        if (&local_c48 != local_6d8) {
          local_538 = &local_c48;
          if (local_c40 != (int *)0x0) {
            local_53c = 0xffffffff;
            LOCK();
            local_540 = *local_c40;
            *local_c40 = *local_c40 + -1;
            UNLOCK();
            if (local_540 == 1) {
              if (local_c28 == (long *)0x0) {
                local_178 = local_c48;
                if (local_c48 != (void *)0x0) {
                  free(local_c48);
                }
              }
              else {
                (**(code **)(*local_c28 + 0x18))(local_c28,local_c48);
              }
            }
          }
          local_c48 = (void *)0x0;
          local_c38 = (void *)0x0;
          local_c30 = 0;
          local_c20 = 0;
          local_c1c = 0;
          local_c18 = 0;
          local_c14 = 0;
          local_c10 = 0;
          local_c08 = (void *)0x0;
          local_c40 = (int *)0x0;
          local_c48 = *local_6d8;
          local_c40 = (int *)local_6d8[1];
          local_c38 = local_6d8[2];
          local_c30 = *(undefined4 *)(local_6d8 + 3);
          local_c28 = (long *)local_6d8[4];
          local_c20 = *(undefined4 *)(local_6d8 + 5);
          local_c1c = *(undefined4 *)((long)local_6d8 + 0x2c);
          local_c18 = *(undefined4 *)(local_6d8 + 6);
          local_c14 = *(undefined4 *)((long)local_6d8 + 0x34);
          local_c10 = *(undefined4 *)(local_6d8 + 7);
          local_c08 = local_6d8[8];
        }
        local_760 = &local_d68;
        local_6c8 = &local_c48;
        local_468 = local_760;
        if (local_d60 != (int *)0x0) {
          local_46c = 0xffffffff;
          LOCK();
          local_470 = *local_d60;
          *local_d60 = *local_d60 + -1;
          UNLOCK();
          if (local_470 == 1) {
            if (local_d48 == (long *)0x0) {
              local_1e0 = local_d68;
              if (local_d68 != (void *)0x0) {
                free(local_d68);
              }
            }
            else {
              (**(code **)(*local_d48 + 0x18))(local_d48,local_d68);
            }
          }
        }
        local_d68 = (void *)0x0;
        local_d58 = 0;
        local_d50 = 0;
        local_d40 = 0;
        local_d3c = 0;
        local_d38 = 0;
        local_d34 = 0;
        local_d30 = 0;
        local_d28 = 0;
        local_d60 = (int *)0x0;
        local_750 = &local_d20;
        local_488 = local_750;
        if (local_d18 != (int *)0x0) {
          local_48c = 0xffffffff;
          LOCK();
          local_490 = *local_d18;
          *local_d18 = *local_d18 + -1;
          UNLOCK();
          if (local_490 == 1) {
            if (local_d00 == (long *)0x0) {
              local_1d0 = local_d20;
              if (local_d20 != (undefined4 *)0x0) {
                free(local_d20);
              }
            }
            else {
              (**(code **)(*local_d00 + 0x18))(local_d00,local_d20);
            }
          }
        }
        local_d20 = (undefined4 *)0x0;
        local_d10 = 0;
        local_d08 = 0;
        local_cf8 = 0;
        local_cf4 = 0;
        local_cf0 = 0;
        local_cec = 0;
        local_ce8 = 0;
        local_ce0 = 0;
        local_d18 = (int *)0x0;
      }
      if (100 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c)) {
        lVar1 = *(long *)(*in_RDI + -0x18);
        local_378 = (long *)((long)in_RDI + lVar1 + 0x288);
        local_370 = &local_db0;
        local_37c = local_810;
        local_380 = 1;
        local_28 = (void *)(*local_378 + (long)local_810 * *(long *)((long)in_RDI + lVar1 + 0x298));
        local_30 = *(undefined8 *)((long)in_RDI + lVar1 + 0x298);
        local_34 = *(undefined4 *)((long)in_RDI + lVar1 + 0x2a0);
        local_40 = *(long **)((long)in_RDI + lVar1 + 0x2a8);
        local_18 = &local_db0;
        local_1c = 1;
        local_db0 = local_28;
        local_da8 = (int *)0x0;
        local_da0 = local_30;
        local_d98 = local_34;
        local_d90 = local_40;
        local_d88 = 1;
        local_d84 = 1;
        local_d80 = 1;
        local_d7c = 1;
        local_d78 = 1;
        local_d70 = 1;
        local_6f8 = &local_db0;
        local_6f0 = &local_c00;
        if (&local_c00 != local_6f8) {
          local_528 = &local_c00;
          if (local_bf8 != (int *)0x0) {
            local_52c = 0xffffffff;
            LOCK();
            local_530 = *local_bf8;
            *local_bf8 = *local_bf8 + -1;
            UNLOCK();
            if (local_530 == 1) {
              if (local_be0 == (long *)0x0) {
                local_180 = local_c00;
                if (local_c00 != (void *)0x0) {
                  free(local_c00);
                }
              }
              else {
                (**(code **)(*local_be0 + 0x18))(local_be0,local_c00);
              }
            }
          }
          local_c00 = (void *)0x0;
          local_bf0 = (void *)0x0;
          local_be8 = 0;
          local_bd8 = 0;
          local_bd4 = 0;
          local_bd0 = 0;
          local_bcc = 0;
          local_bc8 = 0;
          local_bc0 = (void *)0x0;
          local_bf8 = (int *)0x0;
          local_c00 = *local_6f8;
          local_bf8 = (int *)local_6f8[1];
          local_bf0 = local_6f8[2];
          local_be8 = *(undefined4 *)(local_6f8 + 3);
          local_be0 = (long *)local_6f8[4];
          local_bd8 = *(undefined4 *)(local_6f8 + 5);
          local_bd4 = *(undefined4 *)((long)local_6f8 + 0x2c);
          local_bd0 = *(undefined4 *)(local_6f8 + 6);
          local_bcc = *(undefined4 *)((long)local_6f8 + 0x34);
          local_bc8 = *(undefined4 *)(local_6f8 + 7);
          local_bc0 = local_6f8[8];
        }
        local_740 = &local_db0;
        local_6e8 = &local_c00;
        local_4a8 = local_740;
        if (local_da8 != (int *)0x0) {
          local_4ac = 0xffffffff;
          LOCK();
          local_4b0 = *local_da8;
          *local_da8 = *local_da8 + -1;
          UNLOCK();
          if (local_4b0 == 1) {
            if (local_d90 == (long *)0x0) {
              local_1c0 = local_db0;
              if (local_db0 != (void *)0x0) {
                free(local_db0);
              }
            }
            else {
              (**(code **)(*local_d90 + 0x18))(local_d90,local_db0);
            }
          }
        }
        local_db0 = (void *)0x0;
        local_da0 = 0;
        local_d98 = 0;
        local_d88 = 0;
        local_d84 = 0;
        local_d80 = 0;
        local_d7c = 0;
        local_d78 = 0;
        local_d70 = 0;
        local_da8 = (int *)0x0;
      }
      pLVar4 = local_948;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
      (*pLVar4->_vptr_Layer[3])(pLVar4,local_dc0);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_ffffffffffffefb0)
      ;
      local_ff8 = (Mat *)auStack_bb8;
      do {
        pMVar8 = local_ff8 + -1;
        local_730 = pMVar8;
        local_4c8 = pMVar8;
        if (local_ff8[-1].refcount != (int *)0x0) {
          piVar2 = local_ff8[-1].refcount;
          local_4cc = 0xffffffff;
          LOCK();
          local_4d0 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_4d0 == 1) {
            if (local_ff8[-1].allocator == (Allocator *)0x0) {
              local_1b0 = pMVar8->data;
              if (local_1b0 != (void *)0x0) {
                free(local_1b0);
              }
            }
            else {
              (*(local_ff8[-1].allocator)->_vptr_Allocator[3])(local_ff8[-1].allocator,pMVar8->data)
              ;
            }
          }
        }
        pMVar8->data = (void *)0x0;
        local_ff8[-1].elemsize = 0;
        local_ff8[-1].elempack = 0;
        local_ff8[-1].dims = 0;
        local_ff8[-1].w = 0;
        local_ff8[-1].h = 0;
        local_ff8[-1].d = 0;
        local_ff8[-1].c = 0;
        local_ff8[-1].cstep = 0;
        local_ff8[-1].refcount = (int *)0x0;
        local_ff8 = pMVar8;
      } while (pMVar8 != &local_cd8);
    }
    else {
      local_e38 = &local_ac8;
      do {
        local_7e0 = local_e38;
        local_e38->data = (void *)0x0;
        local_e38->refcount = (int *)0x0;
        local_e38->elemsize = 0;
        local_e38->elempack = 0;
        local_e38->allocator = (Allocator *)0x0;
        local_e38->dims = 0;
        local_e38->w = 0;
        local_e38->h = 0;
        local_e38->d = 0;
        local_e38->c = 0;
        local_e38->cstep = 0;
        local_e38 = local_e38 + 1;
      } while (local_e38 != (Mat *)auStack_960);
      local_5f8 = &local_858;
      local_5f0 = &local_ac8;
      if (&local_ac8 != local_5f8) {
        if (local_858.refcount != (int *)0x0) {
          local_5fc = 1;
          LOCK();
          local_600 = *local_858.refcount;
          *local_858.refcount = *local_858.refcount + 1;
          UNLOCK();
        }
        local_5a8 = &local_ac8;
        if (local_ac8.refcount != (int *)0x0) {
          local_5ac = 0xffffffff;
          LOCK();
          local_5b0 = *local_ac8.refcount;
          *local_ac8.refcount = *local_ac8.refcount + -1;
          UNLOCK();
          if (local_5b0 == 1) {
            if (local_ac8.allocator == (Allocator *)0x0) {
              local_140 = local_ac8.data;
              if (local_ac8.data != (void *)0x0) {
                free(local_ac8.data);
              }
            }
            else {
              (*(local_ac8.allocator)->_vptr_Allocator[3])(local_ac8.allocator,local_ac8.data);
            }
          }
        }
        local_ac8.data = local_5f8->data;
        local_ac8.refcount = local_5f8->refcount;
        local_ac8.elemsize = local_5f8->elemsize;
        local_ac8.elempack = local_5f8->elempack;
        local_ac8.allocator = local_5f8->allocator;
        local_ac8.dims = local_5f8->dims;
        local_ac8.w = local_5f8->w;
        local_ac8.h = local_5f8->h;
        local_ac8.d = local_5f8->d;
        local_ac8.c = local_5f8->c;
        local_ac8.cstep = local_5f8->cstep;
      }
      local_618 = &local_8f8;
      local_610 = &local_a80;
      local_5e8 = &local_ac8;
      if (&local_a80 != local_618) {
        if (local_8f8.refcount != (int *)0x0) {
          local_61c = 1;
          LOCK();
          local_620 = *local_8f8.refcount;
          *local_8f8.refcount = *local_8f8.refcount + 1;
          UNLOCK();
        }
        local_598 = &local_a80;
        if (local_a80.refcount != (int *)0x0) {
          local_59c = 0xffffffff;
          LOCK();
          local_5a0 = *local_a80.refcount;
          *local_a80.refcount = *local_a80.refcount + -1;
          UNLOCK();
          if (local_5a0 == 1) {
            if (local_a80.allocator == (Allocator *)0x0) {
              local_148 = local_a80.data;
              if (local_a80.data != (void *)0x0) {
                free(local_a80.data);
              }
            }
            else {
              (*(local_a80.allocator)->_vptr_Allocator[3])(local_a80.allocator,local_a80.data);
            }
          }
        }
        local_a80.data = local_618->data;
        local_a80.refcount = local_618->refcount;
        local_a80.elemsize = local_618->elemsize;
        local_a80.elempack = local_618->elempack;
        local_a80.allocator = local_618->allocator;
        local_a80.dims = local_618->dims;
        local_a80.w = local_618->w;
        local_a80.h = local_618->h;
        local_a80.d = local_618->d;
        local_a80.c = local_618->c;
        local_a80.cstep = local_618->cstep;
      }
      local_608 = &local_a80;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
        local_2d8 = &local_b10;
        local_2dc = local_80c;
        local_2e8 = 4;
        local_2f0 = 0;
        local_b10 = (undefined4 *)0x0;
        local_b08 = (int *)0x0;
        local_b00 = 0;
        local_af8 = 0;
        local_af0 = (long *)0x0;
        local_ae8 = 0;
        local_ae4 = 0;
        local_ae0 = 0;
        local_adc = 0;
        local_ad8 = 0;
        local_ad0 = 0;
        Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                    (size_t)in_stack_ffffffffffffefc0,(Allocator *)in_stack_ffffffffffffefb8);
        local_258 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
        local_260 = (long)local_810;
        local_27c = *(undefined4 *)(*local_258 + local_260 * 4);
        local_278 = &local_b10;
        local_280 = (int)local_ad0 * local_ad8;
        local_288 = local_b10;
        for (local_28c = 0; local_28c < local_280; local_28c = local_28c + 1) {
          *local_288 = local_27c;
          local_288 = local_288 + 1;
        }
        local_638 = &local_b10;
        local_630 = &local_a38;
        local_10 = local_278;
        if (&local_a38 != local_638) {
          if (local_b08 != (int *)0x0) {
            local_63c = 1;
            LOCK();
            local_640 = *local_b08;
            *local_b08 = *local_b08 + 1;
            UNLOCK();
          }
          local_588 = &local_a38;
          if (local_a30 != (int *)0x0) {
            local_58c = 0xffffffff;
            LOCK();
            local_590 = *local_a30;
            *local_a30 = *local_a30 + -1;
            UNLOCK();
            if (local_590 == 1) {
              if (local_a18 == (long *)0x0) {
                local_150 = local_a38;
                if (local_a38 != (undefined4 *)0x0) {
                  free(local_a38);
                }
              }
              else {
                (**(code **)(*local_a18 + 0x18))(local_a18,local_a38);
              }
            }
          }
          local_a38 = (undefined4 *)0x0;
          local_a28 = (undefined4 *)0x0;
          local_a20 = 0;
          local_a10 = 0;
          local_a0c = 0;
          local_a08 = 0;
          local_a04 = 0;
          local_a00 = 0;
          local_9f8 = (undefined4 *)0x0;
          local_a30 = (int *)0x0;
          local_a38 = *local_638;
          local_a30 = local_638[1];
          local_a28 = local_638[2];
          local_a20 = *(undefined4 *)(local_638 + 3);
          local_a18 = (long *)local_638[4];
          local_a10 = *(undefined4 *)(local_638 + 5);
          local_a0c = *(undefined4 *)((long)local_638 + 0x2c);
          local_a08 = *(undefined4 *)(local_638 + 6);
          local_a04 = *(undefined4 *)((long)local_638 + 0x34);
          local_a00 = *(undefined4 *)(local_638 + 7);
          local_9f8 = local_638[8];
        }
        lVar1 = *(long *)(*in_RDI + -0x18);
        local_330 = (long *)((long)in_RDI + lVar1 + 0x240);
        local_328 = &local_b58;
        local_334 = local_810;
        local_338 = 1;
        local_b8 = (void *)(*local_330 + (long)local_810 * *(long *)((long)in_RDI + lVar1 + 0x250));
        local_c0 = *(undefined8 *)((long)in_RDI + lVar1 + 0x250);
        local_c4 = *(undefined4 *)((long)in_RDI + lVar1 + 600);
        local_d0 = *(long **)((long)in_RDI + lVar1 + 0x260);
        local_a8 = &local_b58;
        local_ac = 1;
        local_b58 = local_b8;
        local_b50 = (int *)0x0;
        local_b48 = local_c0;
        local_b40 = local_c4;
        local_b38 = local_d0;
        local_b30 = 1;
        local_b2c = 1;
        local_b28 = 1;
        local_b24 = 1;
        local_b20 = 1;
        local_b18 = 1;
        local_658 = &local_b58;
        local_650 = &local_9f0;
        local_628 = &local_a38;
        if (&local_9f0 != local_658) {
          local_578 = &local_9f0;
          if (local_9e8 != (int *)0x0) {
            local_57c = 0xffffffff;
            LOCK();
            local_580 = *local_9e8;
            *local_9e8 = *local_9e8 + -1;
            UNLOCK();
            if (local_580 == 1) {
              if (local_9d0 == (long *)0x0) {
                local_158 = local_9f0;
                if (local_9f0 != (void *)0x0) {
                  free(local_9f0);
                }
              }
              else {
                (**(code **)(*local_9d0 + 0x18))(local_9d0,local_9f0);
              }
            }
          }
          local_9f0 = (void *)0x0;
          local_9e0 = (void *)0x0;
          local_9d8 = 0;
          local_9c8 = 0;
          local_9c4 = 0;
          local_9c0 = 0;
          local_9bc = 0;
          local_9b8 = 0;
          local_9b0 = (void *)0x0;
          local_9e8 = (int *)0x0;
          local_9f0 = *local_658;
          local_9e8 = (int *)local_658[1];
          local_9e0 = local_658[2];
          local_9d8 = *(undefined4 *)(local_658 + 3);
          local_9d0 = (long *)local_658[4];
          local_9c8 = *(undefined4 *)(local_658 + 5);
          local_9c4 = *(undefined4 *)((long)local_658 + 0x2c);
          local_9c0 = *(undefined4 *)(local_658 + 6);
          local_9bc = *(undefined4 *)((long)local_658 + 0x34);
          local_9b8 = *(undefined4 *)(local_658 + 7);
          local_9b0 = local_658[8];
        }
        local_7a8 = &local_b58;
        local_648 = &local_9f0;
        local_3d8 = local_7a8;
        if (local_b50 != (int *)0x0) {
          local_3dc = 0xffffffff;
          LOCK();
          local_3e0 = *local_b50;
          *local_b50 = *local_b50 + -1;
          UNLOCK();
          if (local_3e0 == 1) {
            if (local_b38 == (long *)0x0) {
              local_228 = local_b58;
              if (local_b58 != (void *)0x0) {
                free(local_b58);
              }
            }
            else {
              (**(code **)(*local_b38 + 0x18))(local_b38,local_b58);
            }
          }
        }
        local_b58 = (void *)0x0;
        local_b48 = 0;
        local_b40 = 0;
        local_b30 = 0;
        local_b2c = 0;
        local_b28 = 0;
        local_b24 = 0;
        local_b20 = 0;
        local_b18 = 0;
        local_b50 = (int *)0x0;
        local_798 = &local_b10;
        local_3f8 = local_798;
        if (local_b08 != (int *)0x0) {
          local_3fc = 0xffffffff;
          LOCK();
          local_400 = *local_b08;
          *local_b08 = *local_b08 + -1;
          UNLOCK();
          if (local_400 == 1) {
            if (local_af0 == (long *)0x0) {
              local_218 = local_b10;
              if (local_b10 != (undefined4 *)0x0) {
                free(local_b10);
              }
            }
            else {
              (**(code **)(*local_af0 + 0x18))(local_af0,local_b10);
            }
          }
        }
        local_b10 = (undefined4 *)0x0;
        local_b00 = 0;
        local_af8 = 0;
        local_ae8 = 0;
        local_ae4 = 0;
        local_ae0 = 0;
        local_adc = 0;
        local_ad8 = 0;
        local_ad0 = 0;
        local_b08 = (int *)0x0;
      }
      if (100 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c)) {
        lVar1 = *(long *)(*in_RDI + -0x18);
        local_348 = (long *)((long)in_RDI + lVar1 + 0x288);
        local_340 = &local_ba0;
        local_34c = local_810;
        local_350 = 1;
        local_88 = (void *)(*local_348 + (long)local_810 * *(long *)((long)in_RDI + lVar1 + 0x298));
        local_90 = *(undefined8 *)((long)in_RDI + lVar1 + 0x298);
        local_94 = *(int *)((long)in_RDI + lVar1 + 0x2a0);
        local_a0 = *(long **)((long)in_RDI + lVar1 + 0x2a8);
        local_78 = &local_ba0;
        local_7c = 1;
        local_ba0 = local_88;
        local_b98 = (Allocator *)0x0;
        local_b90._0_4_ = (int)local_90;
        local_b90._4_4_ = SUB84(local_90,4);
        local_b88 = local_94;
        local_b80 = local_a0;
        local_b78 = 1;
        local_b74 = 1;
        local_b70 = 1;
        local_b6c = 1;
        local_b68 = 1;
        local_b60 = 1;
        local_678 = &local_ba0;
        local_670 = &local_9a8;
        if (&local_9a8 != local_678) {
          local_568 = &local_9a8;
          if (local_9a0 != (int *)0x0) {
            local_56c = 0xffffffff;
            LOCK();
            local_570 = *local_9a0;
            *local_9a0 = *local_9a0 + -1;
            UNLOCK();
            if (local_570 == 1) {
              if (local_988 == (long *)0x0) {
                local_160 = local_9a8;
                if (local_9a8 != (void *)0x0) {
                  free(local_9a8);
                }
              }
              else {
                (**(code **)(*local_988 + 0x18))(local_988,local_9a8);
              }
            }
          }
          local_9a8 = (void *)0x0;
          local_998 = (void *)0x0;
          local_990 = 0;
          local_980 = 0;
          local_97c = 0;
          local_978 = 0;
          local_974 = 0;
          local_970 = 0;
          local_968 = (void *)0x0;
          local_9a0 = (int *)0x0;
          local_9a8 = *local_678;
          local_9a0 = (int *)local_678[1];
          local_998 = local_678[2];
          local_990 = *(undefined4 *)(local_678 + 3);
          local_988 = (long *)local_678[4];
          local_980 = *(undefined4 *)(local_678 + 5);
          local_97c = *(undefined4 *)((long)local_678 + 0x2c);
          local_978 = *(undefined4 *)(local_678 + 6);
          local_974 = *(undefined4 *)((long)local_678 + 0x34);
          local_970 = *(undefined4 *)(local_678 + 7);
          local_968 = local_678[8];
        }
        local_788 = &local_ba0;
        local_668 = &local_9a8;
        local_418 = local_788;
        if (local_b98 != (Allocator *)0x0) {
          local_41c = 0xffffffff;
          LOCK();
          local_420 = *(int *)&local_b98->_vptr_Allocator;
          *(int *)&local_b98->_vptr_Allocator = *(int *)&local_b98->_vptr_Allocator + -1;
          UNLOCK();
          if (local_420 == 1) {
            if (local_b80 == (long *)0x0) {
              local_208 = local_ba0;
              if (local_ba0 != (void *)0x0) {
                free(local_ba0);
              }
            }
            else {
              (**(code **)(*local_b80 + 0x18))(local_b80,local_ba0);
            }
          }
        }
        local_ba0 = (void *)0x0;
        local_b90._0_4_ = 0;
        local_b90._4_4_ = 0;
        local_b88 = 0;
        local_b78 = 0;
        local_b74 = 0;
        local_b70 = 0;
        local_b6c = 0;
        local_b68 = 0;
        local_b60 = 0;
        local_b98 = (Allocator *)0x0;
      }
      pLVar4 = local_948;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
      (*pLVar4->_vptr_Layer[3])(pLVar4,auStack_bb8 + 8);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_ffffffffffffefb0)
      ;
      local_f00 = (Mat *)auStack_960;
      do {
        pMVar8 = local_f00 + -1;
        local_778 = pMVar8;
        local_438 = pMVar8;
        if (local_f00[-1].refcount != (int *)0x0) {
          piVar2 = local_f00[-1].refcount;
          local_43c = 0xffffffff;
          LOCK();
          local_440 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_440 == 1) {
            if (local_f00[-1].allocator == (Allocator *)0x0) {
              local_1f8 = pMVar8->data;
              if (local_1f8 != (void *)0x0) {
                free(local_1f8);
              }
            }
            else {
              (*(local_f00[-1].allocator)->_vptr_Allocator[3])(local_f00[-1].allocator,pMVar8->data)
              ;
            }
          }
        }
        pMVar8->data = (void *)0x0;
        local_f00[-1].elemsize = 0;
        local_f00[-1].elempack = 0;
        local_f00[-1].dims = 0;
        local_f00[-1].w = 0;
        local_f00[-1].h = 0;
        local_f00[-1].d = 0;
        local_f00[-1].c = 0;
        local_f00[-1].cstep = 0;
        local_f00[-1].refcount = (int *)0x0;
        local_f00 = pMVar8;
      } while (pMVar8 != &local_ac8);
    }
    (*local_948->_vptr_Layer[4])(local_948,local_7f8);
    in_stack_ffffffffffffefc0 = local_948;
    ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_810);
    *ppLVar7 = in_stack_ffffffffffffefc0;
    ParamDict::~ParamDict(in_stack_ffffffffffffefb0);
    in_stack_ffffffffffffefc8 = &local_8f8;
    local_720 = in_stack_ffffffffffffefc8;
    local_4e8 = in_stack_ffffffffffffefc8;
    if (local_8f8.refcount != (int *)0x0) {
      local_4ec = 0xffffffff;
      LOCK();
      local_4f0 = *local_8f8.refcount;
      *local_8f8.refcount = *local_8f8.refcount + -1;
      UNLOCK();
      if (local_4f0 == 1) {
        if (local_8f8.allocator == (Allocator *)0x0) {
          local_1a0 = (Allocator *)local_8f8.data;
          if ((Allocator *)local_8f8.data != (Allocator *)0x0) {
            free(local_8f8.data);
          }
        }
        else {
          (*(local_8f8.allocator)->_vptr_Allocator[3])(local_8f8.allocator,local_8f8.data);
        }
      }
    }
    in_stack_ffffffffffffefc8->data = (void *)0x0;
    in_stack_ffffffffffffefc8->elemsize = 0;
    in_stack_ffffffffffffefc8->elempack = 0;
    in_stack_ffffffffffffefc8->dims = 0;
    in_stack_ffffffffffffefc8->w = 0;
    in_stack_ffffffffffffefc8->h = 0;
    in_stack_ffffffffffffefc8->d = 0;
    in_stack_ffffffffffffefc8->c = 0;
    in_stack_ffffffffffffefc8->cstep = 0;
    in_stack_ffffffffffffefc8->refcount = (int *)0x0;
    in_stack_ffffffffffffefb8 = &local_858;
    local_710 = in_stack_ffffffffffffefb8;
    local_508 = in_stack_ffffffffffffefb8;
    if (local_858.refcount != (int *)0x0) {
      local_50c = 0xffffffff;
      LOCK();
      local_510 = *local_858.refcount;
      *local_858.refcount = *local_858.refcount + -1;
      UNLOCK();
      if (local_510 == 1) {
        if (local_858.allocator == (Allocator *)0x0) {
          if (local_858.data != (void *)0x0) {
            free(local_858.data);
          }
        }
        else {
          (*(local_858.allocator)->_vptr_Allocator[3])(local_858.allocator,local_858.data);
        }
      }
    }
    in_stack_ffffffffffffefb8->data = (void *)0x0;
    in_stack_ffffffffffffefb8->elemsize = 0;
    in_stack_ffffffffffffefb8->elempack = 0;
    in_stack_ffffffffffffefb8->dims = 0;
    in_stack_ffffffffffffefb8->w = 0;
    in_stack_ffffffffffffefb8->h = 0;
    in_stack_ffffffffffffefb8->d = 0;
    in_stack_ffffffffffffefb8->c = 0;
    in_stack_ffffffffffffefb8->cstep = 0;
    in_stack_ffffffffffffefb8->refcount = (int *)0x0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}